

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptAnnotations(HlslGrammar *this,TQualifier *param_1)

{
  int *piVar1;
  bool bVar2;
  TIntermNode *in_RAX;
  TIntermNode *node;
  TIntermNode *local_18;
  
  local_18 = in_RAX;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar2) {
    piVar1 = &this->parseContext->annotationNestingLevel;
    *piVar1 = *piVar1 + 1;
    do {
      do {
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      } while (bVar2);
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
      if (bVar2) {
        piVar1 = &this->parseContext->annotationNestingLevel;
        *piVar1 = *piVar1 + -1;
        return true;
      }
      local_18 = (TIntermNode *)0x0;
      bVar2 = acceptDeclaration(this,&local_18);
    } while (bVar2);
    expected(this,"declaration in annotation");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptAnnotations(TQualifier&)
{
    if (! acceptTokenClass(EHTokLeftAngle))
        return false;

    // note that we are nesting a name space
    parseContext.nestAnnotations();

    // declaration SEMI_COLON ... declaration SEMICOLON RIGHT_ANGLE
    do {
        // eat any extra SEMI_COLON; don't know if the grammar calls for this or not
        while (acceptTokenClass(EHTokSemicolon))
            ;

        if (acceptTokenClass(EHTokRightAngle))
            break;

        // declaration
        TIntermNode* node = nullptr;
        if (! acceptDeclaration(node)) {
            expected("declaration in annotation");
            return false;
        }
    } while (true);

    parseContext.unnestAnnotations();
    return true;
}